

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O1

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InstDebugPrintfPass::NewMemberName
          (InstDebugPrintfPass *this,uint32_t id,uint32_t member_index,string *name_str)

{
  ulong uVar1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_00;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined4 in_register_00000034;
  long *in_R8;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_01;
  size_t byte_index;
  ulong uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  uint32_t word;
  int local_184 [3];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  undefined1 local_158 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_138;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_130;
  IRContext *local_128;
  undefined1 local_120 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_100;
  undefined1 local_f8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_d8;
  initializer_list<spvtools::opt::Operand> local_d0;
  Operand local_c0;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  undefined1 local_58 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  local_128 = *(IRContext **)(CONCAT44(in_register_00000034,id) + 0x28);
  local_184[2] = 6;
  uVar5 = 0;
  local_184[1] = 0;
  local_184[0] = 0;
  local_f8._24_8_ = local_f8 + 0x10;
  local_f8._0_8_ = &PTR__SmallVector_003e9b28;
  local_d8._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_f8._8_8_ = 1;
  local_c0.type = SPV_OPERAND_TYPE_ID;
  local_c0.words._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
  local_c0.words.size_ = 0;
  local_c0.words.small_data_ = (uint *)local_c0.words.buffer;
  local_c0.words.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_130._M_head_impl = (Instruction *)this;
  local_f8._16_4_ = member_index;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (&local_c0.words,(SmallVector<unsigned_int,_2UL> *)local_f8);
  local_120._24_8_ = local_120 + 0x10;
  local_120._0_8_ = &PTR__SmallVector_003e9b28;
  local_100._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_120._16_4_ = SUB84(name_str,0);
  local_120._8_8_ = 1;
  local_90 = 6;
  local_88._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
  local_88.size_ = 0;
  local_88.small_data_ = (uint *)local_88.buffer;
  local_88.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (&local_88,(SmallVector<unsigned_int,_2UL> *)local_120);
  local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_158._0_4_ = 0;
  uVar1 = in_R8[1];
  do {
    uVar2 = 0;
    if (uVar5 < uVar1) {
      uVar2 = (uint)*(byte *)(*in_R8 + uVar5);
    }
    uVar3 = (uint)uVar5 & 3;
    local_158._0_4_ = uVar2 << (char)uVar3 * '\b' | local_158._0_4_;
    if (uVar3 == 3) {
      if (local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_178,
                   (iterator)
                   local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)local_158);
      }
      else {
        *local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_158._0_4_;
        local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_158._0_4_ = 0;
    }
    this_00._M_head_impl = local_130._M_head_impl;
    uVar5 = uVar5 + 1;
  } while (uVar5 <= uVar1);
  if (((int)uVar1 + 1U & 3) != 0) {
    if (local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_178,
                 (iterator)
                 local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_158);
    }
    else {
      *local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_158._0_4_;
      local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)local_158,&local_178);
  local_60 = 0xb;
  local_58._0_8_ = &PTR__SmallVector_003e9b28;
  local_58._8_8_ = 0;
  local_58._24_8_ = local_58 + 0x10;
  this_01 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_38;
  local_38._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_58,(SmallVector<unsigned_int,_2UL> *)local_158)
  ;
  local_d0._M_array = &local_c0;
  local_d0._M_len = 3;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)this_00._M_head_impl,&local_128,(Op *)(local_184 + 2),local_184 + 1,
             local_184,&local_d0);
  lVar4 = -0x90;
  do {
    *(undefined ***)(this_01 + -0x20) = &PTR__SmallVector_003e9b28;
    if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01 !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                (this_01,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01);
    }
    *(undefined8 *)this_01 = 0;
    this_01 = this_01 + -0x30;
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0);
  local_158._0_8_ = &PTR__SmallVector_003e9b28;
  if (local_138._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_138,local_138._M_head_impl);
  }
  local_138._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  if (local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_120._0_8_ = &PTR__SmallVector_003e9b28;
  if (local_100._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_100,local_100._M_head_impl);
  }
  local_f8._0_8_ = &PTR__SmallVector_003e9b28;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_d8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_d8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_d8._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this_00._M_head_impl;
}

Assistant:

std::unique_ptr<Instruction> InstDebugPrintfPass::NewMemberName(
    uint32_t id, uint32_t member_index, const std::string& name_str) {
  return MakeUnique<Instruction>(
      context(), spv::Op::OpMemberName, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {id}},
          {SPV_OPERAND_TYPE_LITERAL_INTEGER, {member_index}},
          {SPV_OPERAND_TYPE_LITERAL_STRING, utils::MakeVector(name_str)}});
}